

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  double local_a8;
  double dStack_a0;
  double local_98;
  vec3 local_88;
  vec3 local_68;
  double local_50;
  double dStack_48;
  double local_40;
  
  reflect(&local_88,&r_in->dir,&rec->normal);
  unit_vector(&local_68,&local_88);
  dVar1 = this->fuzz;
  random_unit_vector();
  local_88.e[2] = local_98 * dVar1 + local_68.e[2];
  local_88.e[0] = dVar1 * local_a8 + local_68.e[0];
  local_88.e[1] = dVar1 * dStack_a0 + local_68.e[1];
  local_68.e[2] = (rec->p).e[2];
  local_68.e[0] = (rec->p).e[0];
  local_68.e[1] = (rec->p).e[1];
  (scattered->orig).e[0] = local_68.e[0];
  (scattered->orig).e[1] = local_68.e[1];
  (scattered->orig).e[2] = local_68.e[2];
  (scattered->dir).e[0] = local_88.e[0];
  (scattered->dir).e[1] = local_88.e[1];
  (scattered->dir).e[2] = local_88.e[2];
  attenuation->e[2] = (this->albedo).e[2];
  dVar1 = (this->albedo).e[1];
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = dVar1;
  local_50 = local_88.e[0];
  dStack_48 = local_88.e[1];
  local_40 = local_88.e[2];
  dVar1 = dot(&scattered->dir,&rec->normal);
  return 0.0 < dVar1;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        vec3 reflected = reflect(r_in.direction(), rec.normal);
        reflected = unit_vector(reflected) + (fuzz * random_unit_vector());
        scattered = ray(rec.p, reflected);
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }